

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp:244:56)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_regexp_object_cpp:244:56)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  undefined1 local_30 [32];
  
  anon_unknown_35::check_type((anon_unknown_35 *)(local_30 + 0x10),&(this->f).global,this_);
  gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_30 + 0x10));
  regexp_object::to_string((regexp_object *)local_30);
  __return_storage_ptr__->type_ = string;
  (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
  heap_ = (gc_heap *)local_30._0_8_;
  *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_30._8_4_;
  if ((gc_heap *)local_30._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_30._0_8_,
                    (gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_30);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_30 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }